

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

void Abc_GenMesh(char *pFileName,int nVars)

{
  uint uVar1;
  FILE *__stream;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (0 < nVars) {
    __stream = fopen(pFileName,"w");
    pcVar2 = Extra_TimeStamp();
    fprintf(__stream,"# %dx%d mesh generated by ABC on %s\n",(ulong)(uint)nVars,(ulong)(uint)nVars,
            pcVar2);
    fprintf(__stream,".model mesh%d\n",(ulong)(uint)nVars);
    uVar7 = 0;
    do {
      uVar5 = 0;
      do {
        fwrite(".inputs",7,1,__stream);
        fprintf(__stream," p%d%dx1",uVar7,(ulong)uVar5);
        fprintf(__stream," p%d%dx2",uVar7,(ulong)uVar5);
        fprintf(__stream," p%d%dy1",uVar7,(ulong)uVar5);
        fprintf(__stream," p%d%dy2",uVar7,(ulong)uVar5);
        fputc(10,__stream);
        uVar5 = uVar5 + 1;
      } while (nVars != uVar5);
      uVar5 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar5;
    } while (uVar5 != nVars);
    fwrite(".inputs",7,1,__stream);
    uVar5 = 1;
    iVar3 = nVars;
    do {
      fprintf(__stream," v%02d v%02d",(ulong)(uVar5 - 1),(ulong)uVar5);
      uVar5 = uVar5 + 2;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    fputc(10,__stream);
    fwrite(".outputs",8,1,__stream);
    fwrite(" fx00",5,1,__stream);
    fputc(10,__stream);
    uVar5 = 1;
    if (1 < nVars) {
      uVar5 = nVars;
    }
    uVar4 = 0;
    do {
      uVar1 = uVar4 + 1;
      uVar6 = 0;
      do {
        fwrite(".subckt cell",0xc,1,__stream);
        fprintf(__stream," px1=p%d%dx1",(ulong)uVar4,(ulong)uVar6);
        fprintf(__stream," px2=p%d%dx2",(ulong)uVar4,(ulong)uVar6);
        fprintf(__stream," py1=p%d%dy1",(ulong)uVar4,(ulong)uVar6);
        fprintf(__stream," py2=p%d%dy2",(ulong)uVar4,(ulong)uVar6);
        if (nVars - 1U == uVar6) {
          fprintf(__stream," x=v%02d",(ulong)uVar4);
        }
        else {
          fprintf(__stream," x=fx%d%d",(ulong)uVar4,(ulong)(uVar6 + 1));
        }
        if (uVar4 == nVars - 1U) {
          fprintf(__stream," y=v%02d",(ulong)(uVar6 + nVars));
        }
        else {
          fprintf(__stream," y=fy%d%d",(ulong)uVar1,(ulong)uVar6);
        }
        fprintf(__stream," fx=fx%d%d",(ulong)uVar4,(ulong)uVar6);
        fprintf(__stream," fy=fy%d%d",(ulong)uVar4,(ulong)uVar6);
        fputc(10,__stream);
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
      uVar4 = uVar1;
    } while (uVar1 != uVar5);
    fwrite(".end\n",5,1,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    Abc_WriteCell((FILE *)__stream);
    fclose(__stream);
    return;
  }
  __assert_fail("nVars > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcGen.c"
                ,0x171,"void Abc_GenMesh(char *, int)");
}

Assistant:

void Abc_GenMesh( char * pFileName, int nVars )
{
    FILE * pFile;
    int i, k;

    assert( nVars > 0 );

    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# %dx%d mesh generated by ABC on %s\n", nVars, nVars, Extra_TimeStamp() );
    fprintf( pFile, ".model mesh%d\n", nVars );

    for ( i = 0; i < nVars; i++ )
        for ( k = 0; k < nVars; k++ )
        {
            fprintf( pFile, ".inputs" );
            fprintf( pFile, " p%d%dx1", i, k );
            fprintf( pFile, " p%d%dx2", i, k );
            fprintf( pFile, " p%d%dy1", i, k );
            fprintf( pFile, " p%d%dy2", i, k );
            fprintf( pFile, "\n" );
        }
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " v%02d v%02d", 2*i, 2*i+1 );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    fprintf( pFile, " fx00" );
    fprintf( pFile, "\n" );

    for ( i = 0; i < nVars; i++ ) // horizontal
        for ( k = 0; k < nVars; k++ ) // vertical
        {
            fprintf( pFile, ".subckt cell" );
            fprintf( pFile, " px1=p%d%dx1", i, k );
            fprintf( pFile, " px2=p%d%dx2", i, k );
            fprintf( pFile, " py1=p%d%dy1", i, k );
            fprintf( pFile, " py2=p%d%dy2", i, k );
            if ( k == nVars - 1 )
                fprintf( pFile, " x=v%02d", i );
            else
                fprintf( pFile, " x=fx%d%d", i, k+1 );
            if ( i == nVars - 1 )
                fprintf( pFile, " y=v%02d", nVars+k );
            else
                fprintf( pFile, " y=fy%d%d", i+1, k );
            // outputs
            fprintf( pFile, " fx=fx%d%d", i, k );
            fprintf( pFile, " fy=fy%d%d", i, k );
            fprintf( pFile, "\n" );
        }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    Abc_WriteCell( pFile );
    fclose( pFile );
}